

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void removeDataBefore(Box<objectbox::tsdemo::SensorValues> box,int64_t time)

{
  ostream *poVar1;
  StopWatch stopWatch;
  QueryBuilder<objectbox::tsdemo::SensorValues> queryBuilder;
  undefined1 local_58 [12];
  QueryOp QStack_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  duration local_38;
  QueryBuilderBase local_30;
  
  obx::QueryBuilderBase::QueryBuilderBase(&local_30,box.super_BoxTypeless.store_,2);
  local_30._vptr_QueryBuilderBase = (_func_int **)&PTR__QueryBuilderBase_00112c90;
  local_58._8_4_ = (PropertyTypeless)0x2;
  QStack_4c = Less;
  local_58._0_8_ = &PTR__QueryCondition_00112a28;
  local_48._8_8_ = 0;
  local_48._M_allocated_capacity = time;
  obx::anon_unknown_3::QCInt64::applyTo((QCInt64 *)local_58,local_30.cQueryBuilder_,false);
  local_38.__r = std::chrono::_V2::steady_clock::now();
  if (local_30.isRoot_ != false) {
    obx::QueryBase::QueryBase((QueryBase *)local_58,local_30.store_,local_30.cQueryBuilder_);
    local_58._0_8_ = &PTR__QueryBase_00112cc8;
    obx::QueryBase::remove((QueryBase *)local_58,(char *)local_30.store_);
    local_58._0_8_ = &PTR__QueryBase_00112bd0;
    obx_query_close(local_48._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Removed old objects in ",0x17);
    objectbox::StopWatch::durationForLog_abi_cxx11_((string *)local_58,(StopWatch *)&local_38);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_58._0_8_,
                        CONCAT44(QStack_4c,local_58._8_4_));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," objects)",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Total objects in DB: ",0x15);
    obx::BoxTypeless::count(&box.super_BoxTypeless,0);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    local_30._vptr_QueryBuilderBase = (_func_int **)&PTR__QueryBuilderBase_00112c00;
    obx_qb_close(local_30.cQueryBuilder_);
    return;
  }
  obx::internal::throwIllegalStateException("State condition failed: ","isRoot_");
}

Assistant:

void removeDataBefore(obx::Box<SensorValues> box, int64_t time) {
    obx::QueryBuilder<SensorValues> queryBuilder = box.query();
    queryBuilder.with(SensorValues_::time.lessThan(time));
    StopWatch stopWatch;
    size_t removeCount = queryBuilder.build().remove();
    std::cout << "Removed old objects in " << stopWatch.durationForLog() << " (" << removeCount << " objects)"
              << std::endl;

    std::cout << "Total objects in DB: " << box.count() << std::endl;
}